

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cc
# Opt level: O1

void __thiscall
RVO::RVOSimulator::RVOSimulator
          (RVOSimulator *this,float timeStep,float neighborDist,size_t maxNeighbors,
          float timeHorizon,float timeHorizonObst,float radius,float maxSpeed,Vector2 *velocity)

{
  Agent *pAVar1;
  KdTree *this_00;
  
  (this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pAVar1 = (Agent *)operator_new(0x90);
  Agent::Agent(pAVar1);
  this->defaultAgent_ = pAVar1;
  this_00 = (KdTree *)operator_new(0x40);
  KdTree::KdTree(this_00,this);
  this->kdTree_ = this_00;
  this->globalTime_ = 0.0;
  this->timeStep_ = timeStep;
  this->defaultAgent_->velocity_ = *velocity;
  pAVar1 = this->defaultAgent_;
  pAVar1->maxNeighbors_ = maxNeighbors;
  pAVar1->maxSpeed_ = maxSpeed;
  pAVar1->neighborDist_ = neighborDist;
  pAVar1->radius_ = radius;
  pAVar1->timeHorizon_ = timeHorizon;
  pAVar1->timeHorizonObst_ = timeHorizonObst;
  return;
}

Assistant:

RVOSimulator::RVOSimulator(float timeStep, float neighborDist,
                           std::size_t maxNeighbors, float timeHorizon,
                           float timeHorizonObst, float radius, float maxSpeed,
                           const Vector2 &velocity)
    : defaultAgent_(new Agent()),
      kdTree_(new KdTree(this)),
      globalTime_(0.0F),
      timeStep_(timeStep) {
  defaultAgent_->velocity_ = velocity;
  defaultAgent_->maxNeighbors_ = maxNeighbors;
  defaultAgent_->maxSpeed_ = maxSpeed;
  defaultAgent_->neighborDist_ = neighborDist;
  defaultAgent_->radius_ = radius;
  defaultAgent_->timeHorizon_ = timeHorizon;
  defaultAgent_->timeHorizonObst_ = timeHorizonObst;
}